

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

bool __thiscall Operand::operator==(Operand *this,Operand *other)

{
  __type_conflict _Var1;
  
  if ((this->type == other->type) && (this->reg_num == other->reg_num)) {
    _Var1 = std::operator==(&this->value,&other->value);
    return _Var1;
  }
  return false;
}

Assistant:

bool operator==(const Operand& other) const {
		return type == other.type && reg_num == other.reg_num && value == other.value;
	}